

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O0

ares_status_t ares_array_insertdata_at(ares_array_t *arr,size_t idx,void *data_ptr)

{
  void *local_38;
  void *ptr;
  void *pvStack_28;
  ares_status_t status;
  void *data_ptr_local;
  size_t idx_local;
  ares_array_t *arr_local;
  
  local_38 = (void *)0x0;
  pvStack_28 = data_ptr;
  data_ptr_local = (void *)idx;
  idx_local = (size_t)arr;
  ptr._4_4_ = ares_array_insert_at(&local_38,arr,idx);
  arr_local._4_4_ = ptr._4_4_;
  if (ptr._4_4_ == ARES_SUCCESS) {
    memcpy(local_38,pvStack_28,*(size_t *)(idx_local + 0x10));
    arr_local._4_4_ = ARES_SUCCESS;
  }
  return arr_local._4_4_;
}

Assistant:

ares_status_t ares_array_insertdata_at(ares_array_t *arr, size_t idx,
                                       const void *data_ptr)
{
  ares_status_t status;
  void         *ptr = NULL;

  status = ares_array_insert_at(&ptr, arr, idx);
  if (status != ARES_SUCCESS) {
    return status;
  }
  memcpy(ptr, data_ptr, arr->member_size);
  return ARES_SUCCESS;
}